

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O1

ChMatrix33<double> * __thiscall
chrono::fea::ChElementBeamANCF_3243::GetPK2Stress
          (ChMatrix33<double> *__return_storage_ptr__,ChElementBeamANCF_3243 *this,double xi,
          double eta,double zeta)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ChMaterialBeamANCF *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  Matrix3xN *pMVar18;
  double *pdVar19;
  Index row;
  long lVar20;
  undefined1 (*pauVar21) [64];
  ActualDstType actualDst;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar28 [32];
  undefined1 auVar32 [64];
  undefined1 auVar29 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  double dVar42;
  double dVar44;
  double dVar45;
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrix33<double> J_0xi;
  MatrixNx3c Sxi_D;
  ChMatrixNM<double,_6,_6> D;
  Matrix3xN e_bar;
  double local_4d0;
  double dStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [32];
  double local_490 [8];
  undefined1 local_450 [16];
  double local_440;
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  double local_410;
  double dStack_408;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  double local_3e0 [2];
  double local_3d0 [4];
  double dStack_3b0;
  double local_3a8;
  double local_3a0;
  double adStack_398 [2];
  Matrix<double,_3,_3,_1,_3,_3> local_388;
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [16];
  double dStack_270;
  double dStack_268;
  double dStack_260;
  double dStack_258;
  double dStack_250;
  double dStack_248;
  double local_240;
  double dStack_238;
  double *pdStack_230;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_228;
  double dStack_220;
  undefined1 auStack_218 [24];
  undefined1 local_200 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  pdVar19 = (double *)local_340;
  Calc_Sxi_D(this,(MatrixNx3c *)pdVar19,xi,eta,zeta);
  pMVar18 = &this->m_ebar0;
  lVar20 = 0x10;
  do {
    auVar32 = *(undefined1 (*) [64])
               (pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>).m_storage.
               m_data.array;
    auVar30 = vmulpd_avx512f(auVar32,local_340);
    auVar27 = vextractf64x4_avx512f(auVar30,1);
    auVar31 = vmulpd_avx512f(auVar32,local_300);
    auVar28 = vextractf64x4_avx512f(auVar31,1);
    auVar32 = vmulpd_avx512f(auVar32,local_2c0);
    auVar29 = vextractf64x4_avx512f(auVar32,1);
    dVar41 = auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_;
    dVar44 = auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
    auVar26._0_8_ = dVar41 + dVar44;
    auVar26._8_8_ = dVar41 + dVar44;
    *(double *)((long)adStack_398 + lVar20) =
         auVar30._0_8_ + auVar27._0_8_ + auVar30._8_8_ + auVar27._8_8_ +
         auVar30._16_8_ + auVar27._16_8_ + auVar30._24_8_ + auVar27._24_8_;
    *(double *)
     ((long)local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + lVar20 + -8) =
         auVar31._0_8_ + auVar28._0_8_ + auVar31._8_8_ + auVar28._8_8_ +
         auVar31._16_8_ + auVar28._16_8_ + auVar31._24_8_ + auVar28._24_8_;
    uVar1 = vmovlpd_avx(auVar26);
    *(undefined8 *)
     ((long)local_388.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + lVar20) = uVar1;
    lVar20 = lVar20 + 0x18;
    pMVar18 = (Matrix3xN *)
              ((pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>).m_storage.
               m_data.array + 8);
  } while (lVar20 != 0x58);
  local_140._8_8_ = &local_388;
  local_280._0_8_ = pdVar19;
  local_140._0_8_ = pdVar19;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_280 + 8),(SrcXprType *)(local_140 + 8),
        (assign_op<double,_double> *)local_3d0);
  pdStack_230 = (double *)local_280._0_8_;
  dStack_220 = 1.48219693752374e-323;
  auVar32 = *(undefined1 (*) [64])local_280._0_8_;
  auVar30._8_8_ = local_280._8_8_;
  auVar30._0_8_ = local_280._8_8_;
  auVar30._16_8_ = local_280._8_8_;
  auVar30._24_8_ = local_280._8_8_;
  auVar30._32_8_ = local_280._8_8_;
  auVar30._40_8_ = local_280._8_8_;
  auVar30._48_8_ = local_280._8_8_;
  auVar30._56_8_ = local_280._8_8_;
  auVar33 = vmulpd_avx512f(auVar32,auVar30);
  auVar30 = *(undefined1 (*) [64])(local_280._0_8_ + 0x40);
  auVar31 = *(undefined1 (*) [64])(local_280._0_8_ + 0x80);
  auVar34._8_8_ = dStack_260;
  auVar34._0_8_ = dStack_260;
  auVar34._16_8_ = dStack_260;
  auVar34._24_8_ = dStack_260;
  auVar34._32_8_ = dStack_260;
  auVar34._40_8_ = dStack_260;
  auVar34._48_8_ = dStack_260;
  auVar34._56_8_ = dStack_260;
  auVar34 = vfmadd231pd_avx512f(auVar33,auVar30,auVar34);
  auVar33._8_8_ = dStack_248;
  auVar33._0_8_ = dStack_248;
  auVar33._16_8_ = dStack_248;
  auVar33._24_8_ = dStack_248;
  auVar33._32_8_ = dStack_248;
  auVar33._40_8_ = dStack_248;
  auVar33._48_8_ = dStack_248;
  auVar33._56_8_ = dStack_248;
  local_340 = vfmadd231pd_avx512f(auVar34,auVar31,auVar33);
  auVar8._8_8_ = dStack_270;
  auVar8._0_8_ = dStack_270;
  auVar8._16_8_ = dStack_270;
  auVar8._24_8_ = dStack_270;
  auVar8._32_8_ = dStack_270;
  auVar8._40_8_ = dStack_270;
  auVar8._48_8_ = dStack_270;
  auVar8._56_8_ = dStack_270;
  auVar34 = vmulpd_avx512f(auVar32,auVar8);
  auVar9._8_8_ = dStack_258;
  auVar9._0_8_ = dStack_258;
  auVar9._16_8_ = dStack_258;
  auVar9._24_8_ = dStack_258;
  auVar9._32_8_ = dStack_258;
  auVar9._40_8_ = dStack_258;
  auVar9._48_8_ = dStack_258;
  auVar9._56_8_ = dStack_258;
  auVar34 = vfmadd231pd_avx512f(auVar34,auVar30,auVar9);
  auVar10._8_8_ = local_240;
  auVar10._0_8_ = local_240;
  auVar10._16_8_ = local_240;
  auVar10._24_8_ = local_240;
  auVar10._32_8_ = local_240;
  auVar10._40_8_ = local_240;
  auVar10._48_8_ = local_240;
  auVar10._56_8_ = local_240;
  local_300 = vfmadd231pd_avx512f(auVar34,auVar31,auVar10);
  auVar11._8_8_ = dStack_268;
  auVar11._0_8_ = dStack_268;
  auVar11._16_8_ = dStack_268;
  auVar11._24_8_ = dStack_268;
  auVar11._32_8_ = dStack_268;
  auVar11._40_8_ = dStack_268;
  auVar11._48_8_ = dStack_268;
  auVar11._56_8_ = dStack_268;
  auVar34 = vmulpd_avx512f(auVar32,auVar11);
  auVar32._8_8_ = dStack_250;
  auVar32._0_8_ = dStack_250;
  auVar32._16_8_ = dStack_250;
  auVar32._24_8_ = dStack_250;
  auVar32._32_8_ = dStack_250;
  auVar32._40_8_ = dStack_250;
  auVar32._48_8_ = dStack_250;
  auVar32._56_8_ = dStack_250;
  auVar32 = vfmadd231pd_avx512f(auVar34,auVar30,auVar32);
  auVar12._8_8_ = dStack_238;
  auVar12._0_8_ = dStack_238;
  auVar12._16_8_ = dStack_238;
  auVar12._24_8_ = dStack_238;
  auVar12._32_8_ = dStack_238;
  auVar12._40_8_ = dStack_238;
  auVar12._48_8_ = dStack_238;
  auVar12._56_8_ = dStack_238;
  local_2c0 = vfmadd231pd_avx512f(auVar32,auVar31,auVar12);
  pMStack_228 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_280 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_140);
  auVar31._8_8_ = local_140._8_8_;
  auVar31._0_8_ = local_140._0_8_;
  auVar31._16_48_ = local_140._16_48_;
  lVar20 = 0x10;
  do {
    auVar32 = *(undefined1 (*) [64])pdVar19;
    auVar30 = vmulpd_avx512f(auVar31,auVar32);
    auVar27 = vextractf64x4_avx512f(auVar30,1);
    auVar34 = vmulpd_avx512f(auVar32,local_100);
    auVar28 = vextractf64x4_avx512f(auVar34,1);
    auVar32 = vmulpd_avx512f(auVar32,local_c0);
    auVar29 = vextractf64x4_avx512f(auVar32,1);
    dVar41 = auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_;
    dVar44 = auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
    auVar25._0_8_ = dVar41 + dVar44;
    auVar25._8_8_ = dVar41 + dVar44;
    *(double *)((long)local_3e0 + lVar20) =
         auVar30._0_8_ + auVar27._0_8_ + auVar30._8_8_ + auVar27._8_8_ +
         auVar30._16_8_ + auVar27._16_8_ + auVar30._24_8_ + auVar27._24_8_;
    *(double *)((long)local_3e0 + lVar20 + 8) =
         auVar34._0_8_ + auVar28._0_8_ + auVar34._8_8_ + auVar28._8_8_ +
         auVar34._16_8_ + auVar28._16_8_ + auVar34._24_8_ + auVar28._24_8_;
    uVar1 = vmovlpd_avx(auVar25);
    *(undefined8 *)((long)local_3d0 + lVar20) = uVar1;
    lVar20 = lVar20 + 0x18;
    pdVar19 = pdVar19 + 8;
  } while (lVar20 != 0x58);
  dVar44 = (local_3d0[2] * local_3d0[2] + local_3d0[0] * local_3d0[0] + local_3d0[1] * local_3d0[1]
           + -1.0) * 0.5;
  dVar41 = adStack_398[1] * local_3a8 + local_3a0 * local_3d0[3] + adStack_398[0] * dStack_3b0;
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (local_3a8 * local_3a8 + local_3d0[3] * local_3d0[3] + dStack_3b0 * dStack_3b0 + -1.0) * 0.5;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar44;
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (adStack_398[1] * adStack_398[1] + local_3a0 * local_3a0 + adStack_398[0] * adStack_398[0] +
       -1.0) * 0.5;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar41;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       adStack_398[1] * local_3d0[2] + local_3a0 * local_3d0[0] + adStack_398[0] * local_3d0[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_3d0[2] * local_3a8 + local_3d0[0] * local_3d0[3] + local_3d0[1] * dStack_3b0
  ;
  if (this->m_damping_enabled == true) {
    local_410 = local_3a0;
    dStack_408 = adStack_398[0];
    local_490[0] = local_3a8;
    local_3e0[0] = local_3d0[3];
    local_3e0[1] = dStack_3b0;
    local_490[1] = local_3d0[2];
    local_430 = auVar53;
    local_420 = auVar51;
    local_400 = auVar23;
    local_3f0 = auVar22;
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_280);
    auVar16._8_8_ = local_280._8_8_;
    auVar16._0_8_ = local_280._0_8_;
    auVar16._16_8_ = dStack_270;
    auVar16._24_8_ = dStack_268;
    auVar16._32_8_ = dStack_260;
    auVar16._40_8_ = dStack_258;
    auVar16._48_8_ = dStack_250;
    auVar16._56_8_ = dStack_248;
    auVar17._8_8_ = dStack_238;
    auVar17._0_8_ = local_240;
    auVar17._16_8_ = pdStack_230;
    auVar17._24_8_ = pMStack_228;
    auVar17._32_8_ = dStack_220;
    auVar17._40_24_ = auStack_218;
    lVar20 = 0x10;
    pauVar21 = &local_340;
    do {
      auVar32 = *pauVar21;
      auVar30 = vmulpd_avx512f(auVar16,auVar32);
      auVar27 = vextractf64x4_avx512f(auVar30,1);
      auVar31 = vmulpd_avx512f(auVar32,auVar17);
      auVar28 = vextractf64x4_avx512f(auVar31,1);
      auVar32 = vmulpd_avx512f(auVar32,local_200);
      auVar29 = vextractf64x4_avx512f(auVar32,1);
      dVar42 = auVar32._0_8_ + auVar29._0_8_ + auVar32._8_8_ + auVar29._8_8_;
      dVar45 = auVar32._16_8_ + auVar29._16_8_ + auVar32._24_8_ + auVar29._24_8_;
      auVar43._0_8_ = dVar42 + dVar45;
      auVar43._8_8_ = dVar42 + dVar45;
      *(double *)((long)local_490 + lVar20) =
           auVar30._0_8_ + auVar27._0_8_ + auVar30._8_8_ + auVar27._8_8_ +
           auVar30._16_8_ + auVar27._16_8_ + auVar30._24_8_ + auVar27._24_8_;
      *(double *)((long)local_490 + lVar20 + 8) =
           auVar31._0_8_ + auVar28._0_8_ + auVar31._8_8_ + auVar28._8_8_ +
           auVar31._16_8_ + auVar28._16_8_ + auVar31._24_8_ + auVar28._24_8_;
      uVar1 = vmovlpd_avx(auVar43);
      *(undefined8 *)((long)local_490 + lVar20 + 0x10) = uVar1;
      lVar20 = lVar20 + 0x18;
      pauVar21 = pauVar21 + 1;
    } while (lVar20 != 0x58);
    auVar13._8_8_ = local_490[3];
    auVar13._0_8_ = local_490[2];
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_490[4];
    auVar14._8_8_ = local_490[6];
    auVar14._0_8_ = local_490[5];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = this->m_Alpha;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar44;
    auVar37._8_8_ = 0;
    auVar37._0_8_ =
         local_490[1] * local_490[4] + local_3d0[0] * local_490[2] + local_3d0[1] * local_490[3];
    auVar26 = vfmadd213sd_fma(auVar37,auVar47,auVar2);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_490[7];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_430._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         local_490[0] * local_490[7] + local_3e0[0] * local_490[5] + local_3e0[1] * local_490[6];
    auVar25 = vfmadd213sd_fma(auVar46,auVar47,auVar3);
    auVar15._8_8_ = dStack_408;
    auVar15._0_8_ = local_410;
    auVar22 = vmulpd_avx512vl(auVar15,local_450);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_440;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = adStack_398[1];
    auVar23 = vmulsd_avx512f(auVar54,auVar50);
    auVar24 = vmulpd_avx512vl(auVar15,auVar14);
    local_4b0._0_16_ = vunpcklpd_avx(auVar26,auVar25);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_420._0_8_;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = auVar23._0_8_ + auVar22._0_8_ + auVar22._8_8_;
    auVar26 = vfmadd213sd_fma(auVar49,auVar47,auVar4);
    auVar25 = vmulsd_avx512f(auVar54,auVar48);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar41;
    auVar38._8_8_ = 0;
    auVar38._0_8_ =
         local_490[0] * local_440 + local_3e0[0] * local_450._0_8_ + local_3e0[1] * local_450._8_8_
         + auVar24._0_8_ + auVar24._8_8_ + auVar25._0_8_;
    auVar25 = vfmadd213sd_fma(auVar38,auVar47,auVar5);
    local_4c0 = vunpcklpd_avx(auVar26,auVar25);
    auVar26 = vmulpd_avx512vl(auVar15,auVar13);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = adStack_398[1];
    auVar25 = vmulsd_avx512f(auVar55,auVar40);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_400._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ =
         auVar25._0_8_ + auVar26._0_8_ + auVar26._8_8_ +
         local_490[1] * local_440 + local_3d0[0] * local_450._0_8_ + local_3d0[1] * local_450._8_8_;
    auVar26 = vfmadd213sd_fma(auVar39,auVar47,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_3f0._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ =
         local_490[0] * local_490[4] + local_3e0[0] * local_490[2] + local_3e0[1] * local_490[3] +
         local_490[1] * local_490[7] + local_3d0[0] * local_490[5] + local_3d0[1] * local_490[6];
    auVar25 = vfmadd213sd_fma(auVar35,auVar47,auVar7);
    auVar26 = vunpcklpd_avx(auVar26,auVar25);
  }
  else {
    local_4b0._0_16_ = vunpcklpd_avx(auVar52,auVar53);
    local_4c0 = vunpcklpd_avx(auVar51,auVar24);
    auVar26 = vunpcklpd_avx(auVar23,auVar22);
  }
  this_00 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->m_material).
            super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  ChMaterialBeamANCF::Get_D(this_00,(ChMatrixNM<double,_6,_6> *)local_280);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pdVar19 = &dStack_260;
  lVar20 = 0;
  local_4d0 = auVar26._0_8_;
  dStack_4c8 = auVar26._8_8_;
  do {
    dVar41 = (double)local_4b0._0_8_ * pdVar19[-4] +
             (double)local_4c0._0_8_ * pdVar19[-2] + local_4d0 * *pdVar19;
    dVar44 = (double)local_4b0._8_8_ * pdVar19[-3] +
             (double)local_4c0._8_8_ * pdVar19[-1] + dStack_4c8 * pdVar19[1];
    auVar36._0_8_ = dVar41 + dVar44;
    auVar36._8_8_ = dVar41 + dVar44;
    dVar41 = (double)vmovlpd_avx(auVar36);
    local_490[lVar20 + 2] = dVar41;
    lVar20 = lVar20 + 1;
    pdVar19 = pdVar19 + 6;
  } while (lVar20 != 6);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_490[2];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_490[3];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_490[4];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_490[5];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_490[5];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_490[6];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_490[6];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_490[7];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_490[7];
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementBeamANCF_3243::GetPK2Stress(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    ChMatrixNM<double, 6, 6> D;
    GetMaterial()->Get_D(D);

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrix33<> SPK2;
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    return SPK2;
}